

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainFrame.c
# Opt level: O2

void Abc_FrameSetJsonObjs(Vec_Wec_t *vObjs)

{
  Vec_WecFreeP(&s_GlobalFrame->vJsonObjs);
  s_GlobalFrame->vJsonObjs = vObjs;
  return;
}

Assistant:

void        Abc_FrameSetJsonObjs( Vec_Wec_t * vObjs )        { Vec_WecFreeP(&s_GlobalFrame->vJsonObjs ); s_GlobalFrame->vJsonObjs = vObjs; }